

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::BeginTabBarEx(ImGuiTabBar *tab_bar,ImRect *tab_bar_bb,ImGuiTabBarFlags flags)

{
  float fVar1;
  ImVec2 IVar2;
  bool bVar3;
  ImGuiWindow *pIVar4;
  ImGuiTabBar *pIVar5;
  ImGuiPtrOrIndex *__src;
  ImGuiContext *pIVar6;
  int iVar7;
  ImU32 col;
  ImGuiPtrOrIndex *__dest;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  ImGuiTabBar *pIVar12;
  size_t __nmemb;
  float fVar13;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar6 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  bVar3 = pIVar4->SkipItems;
  if (bVar3 == false) {
    if (((uint)flags >> 0x14 & 1) == 0) {
      PushOverrideID(tab_bar->ID);
    }
    pIVar5 = (GImGui->TabBars).Buf.Data;
    iVar10 = -1;
    pIVar12 = tab_bar;
    if ((pIVar5 <= tab_bar) && (tab_bar < pIVar5 + (GImGui->TabBars).Buf.Size)) {
      iVar10 = (int)((ulong)((long)tab_bar - (long)pIVar5) >> 3) * 0x286bca1b;
      pIVar12 = (ImGuiTabBar *)0x0;
    }
    iVar7 = (pIVar6->CurrentTabBarStack).Size;
    if (iVar7 == (pIVar6->CurrentTabBarStack).Capacity) {
      if (iVar7 == 0) {
        iVar8 = 8;
      }
      else {
        iVar8 = iVar7 / 2 + iVar7;
      }
      iVar11 = iVar7 + 1;
      if (iVar7 + 1 < iVar8) {
        iVar11 = iVar8;
      }
      __dest = (ImGuiPtrOrIndex *)MemAlloc((long)iVar11 << 4);
      __src = (pIVar6->CurrentTabBarStack).Data;
      if (__src != (ImGuiPtrOrIndex *)0x0) {
        memcpy(__dest,__src,(long)(pIVar6->CurrentTabBarStack).Size << 4);
        MemFree((pIVar6->CurrentTabBarStack).Data);
      }
      (pIVar6->CurrentTabBarStack).Data = __dest;
      (pIVar6->CurrentTabBarStack).Capacity = iVar11;
      iVar7 = (pIVar6->CurrentTabBarStack).Size;
    }
    else {
      __dest = (pIVar6->CurrentTabBarStack).Data;
    }
    __dest[iVar7].Ptr = pIVar12;
    __dest[iVar7].Index = iVar10;
    (pIVar6->CurrentTabBarStack).Size = (pIVar6->CurrentTabBarStack).Size + 1;
    pIVar6->CurrentTabBar = tab_bar;
    tab_bar->BackupCursorPos = (pIVar4->DC).CursorPos;
    iVar10 = tab_bar->CurrFrameVisible;
    if (iVar10 == pIVar6->FrameCount) {
      fVar13 = (tab_bar->BarRect).Max.y;
      fVar1 = tab_bar->ItemSpacingY;
      (pIVar4->DC).CursorPos.x = (tab_bar->BarRect).Min.x;
      (pIVar4->DC).CursorPos.y = fVar13 + fVar1;
      tab_bar->BeginCount = tab_bar->BeginCount + '\x01';
    }
    else {
      if ((((flags & 1U) != (tab_bar->Flags & 1U)) ||
          (((flags & 1U) == 0 && (tab_bar->TabsAddedNew != false)))) &&
         (__nmemb = (size_t)(tab_bar->Tabs).Size, 1 < __nmemb)) {
        qsort((tab_bar->Tabs).Data,__nmemb,0x2c,TabItemComparerByBeginOrder);
        iVar10 = tab_bar->CurrFrameVisible;
      }
      tab_bar->TabsAddedNew = false;
      uVar9 = flags | 0x40;
      if ((flags & 0xc0U) != 0) {
        uVar9 = flags;
      }
      tab_bar->Flags = uVar9;
      IVar2 = tab_bar_bb->Max;
      (tab_bar->BarRect).Min = tab_bar_bb->Min;
      (tab_bar->BarRect).Max = IVar2;
      tab_bar->WantLayout = true;
      tab_bar->PrevFrameVisible = iVar10;
      tab_bar->CurrFrameVisible = pIVar6->FrameCount;
      tab_bar->PrevTabsContentsHeight = tab_bar->CurrTabsContentsHeight;
      tab_bar->CurrTabsContentsHeight = 0.0;
      fVar13 = (pIVar6->Style).ItemSpacing.y;
      tab_bar->ItemSpacingY = fVar13;
      tab_bar->FramePadding = (pIVar6->Style).FramePadding;
      tab_bar->TabsActiveCount = 0;
      tab_bar->BeginCount = '\x01';
      fVar1 = (tab_bar->BarRect).Max.y;
      (pIVar4->DC).CursorPos.x = (tab_bar->BarRect).Min.x;
      (pIVar4->DC).CursorPos.y = fVar13 + fVar1;
      col = GetColorU32((uint)((uVar9 >> 0x15 & 1) == 0) * 2 + 0x23,1.0);
      fVar13 = (float)(int)((pIVar4->WindowPadding).x * 0.5);
      local_38.x = (tab_bar->BarRect).Min.x - fVar13;
      IVar2 = (tab_bar->BarRect).Max;
      local_38.y = IVar2.y + -1.0;
      local_40.y = local_38.y;
      local_40.x = fVar13 + IVar2.x;
      ImDrawList::AddLine(pIVar4->DrawList,&local_38,&local_40,col,1.0);
    }
  }
  return (bool)(bVar3 ^ 1);
}

Assistant:

bool    ImGui::BeginTabBarEx(ImGuiTabBar* tab_bar, const ImRect& tab_bar_bb, ImGuiTabBarFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    if ((flags & ImGuiTabBarFlags_DockNode) == 0)
        PushOverrideID(tab_bar->ID);

    // Add to stack
    g.CurrentTabBarStack.push_back(GetTabBarRefFromTabBar(tab_bar));
    g.CurrentTabBar = tab_bar;

    // Append with multiple BeginTabBar()/EndTabBar() pairs.
    tab_bar->BackupCursorPos = window->DC.CursorPos;
    if (tab_bar->CurrFrameVisible == g.FrameCount)
    {
        window->DC.CursorPos = ImVec2(tab_bar->BarRect.Min.x, tab_bar->BarRect.Max.y + tab_bar->ItemSpacingY);
        tab_bar->BeginCount++;
        return true;
    }

    // Ensure correct ordering when toggling ImGuiTabBarFlags_Reorderable flag, or when a new tab was added while being not reorderable
    if ((flags & ImGuiTabBarFlags_Reorderable) != (tab_bar->Flags & ImGuiTabBarFlags_Reorderable) || (tab_bar->TabsAddedNew && !(flags & ImGuiTabBarFlags_Reorderable)))
        ImQsort(tab_bar->Tabs.Data, tab_bar->Tabs.Size, sizeof(ImGuiTabItem), TabItemComparerByBeginOrder);
    tab_bar->TabsAddedNew = false;

    // Flags
    if ((flags & ImGuiTabBarFlags_FittingPolicyMask_) == 0)
        flags |= ImGuiTabBarFlags_FittingPolicyDefault_;

    tab_bar->Flags = flags;
    tab_bar->BarRect = tab_bar_bb;
    tab_bar->WantLayout = true; // Layout will be done on the first call to ItemTab()
    tab_bar->PrevFrameVisible = tab_bar->CurrFrameVisible;
    tab_bar->CurrFrameVisible = g.FrameCount;
    tab_bar->PrevTabsContentsHeight = tab_bar->CurrTabsContentsHeight;
    tab_bar->CurrTabsContentsHeight = 0.0f;
    tab_bar->ItemSpacingY = g.Style.ItemSpacing.y;
    tab_bar->FramePadding = g.Style.FramePadding;
    tab_bar->TabsActiveCount = 0;
    tab_bar->BeginCount = 1;

    // Set cursor pos in a way which only be used in the off-chance the user erroneously submits item before BeginTabItem(): items will overlap
    window->DC.CursorPos = ImVec2(tab_bar->BarRect.Min.x, tab_bar->BarRect.Max.y + tab_bar->ItemSpacingY);

    // Draw separator
    const ImU32 col = GetColorU32((flags & ImGuiTabBarFlags_IsFocused) ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive);
    const float y = tab_bar->BarRect.Max.y - 1.0f;
    {
        const float separator_min_x = tab_bar->BarRect.Min.x - IM_FLOOR(window->WindowPadding.x * 0.5f);
        const float separator_max_x = tab_bar->BarRect.Max.x + IM_FLOOR(window->WindowPadding.x * 0.5f);
        window->DrawList->AddLine(ImVec2(separator_min_x, y), ImVec2(separator_max_x, y), col, 1.0f);
    }
    return true;
}